

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDiffReporter.cpp
# Opt level: O0

void __thiscall
ApprovalTests::GenericDiffReporter::GenericDiffReporter(GenericDiffReporter *this,DiffInfo *info)

{
  CommandReporter *in_RSI;
  undefined8 *in_RDI;
  DiffInfo *in_stack_00000088;
  string local_50 [14];
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  SystemLauncher *in_stack_ffffffffffffffc0;
  string local_30 [8];
  CommandLauncher *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__GenericDiffReporter_001a1ca0;
  DiffInfo::getProgramForOs_abi_cxx11_(in_stack_00000088);
  ::std::__cxx11::string::string(local_50,(string *)((in_RSI->cmd).field_2._M_local_buf + 8));
  CommandReporter::CommandReporter
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::~string(local_30);
  *in_RDI = &PTR__GenericDiffReporter_001a1ca0;
  SystemLauncher::SystemLauncher
            (in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf,
             (bool)in_stack_ffffffffffffffbe);
  return;
}

Assistant:

GenericDiffReporter::GenericDiffReporter(const DiffInfo& info)
        : CommandReporter(info.getProgramForOs(), info.arguments, &launcher)
    {
    }